

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

void leb__SplittingMatrix(float (*splittingMatrix) [3],uint32_t splitBit)

{
  float local_78 [2];
  lebMatrix3x3 tmp;
  float local_48;
  float local_44;
  lebMatrix3x3 splitMatrix;
  float c;
  float b;
  uint32_t splitBit_local;
  float (*splittingMatrix_local) [3];
  
  local_44 = (float)splitBit;
  local_48 = 1.0 - local_44;
  splitMatrix[0][0] = 0.0;
  splitMatrix[0][1] = 0.5;
  splitMatrix[0][2] = 0.0;
  splitMatrix[1][0] = 0.5;
  splitMatrix[1][1] = 0.0;
  splitMatrix[1][2] = local_48;
  splitMatrix[2][0] = local_44;
  memcpy(local_78,splittingMatrix,0x24);
  leb__Matrix3x3Product((float (*) [3])&local_48,(float (*) [3])local_78,splittingMatrix);
  return;
}

Assistant:

static void
leb__SplittingMatrix(lebMatrix3x3 splittingMatrix, uint32_t splitBit)
{
    float b = float(splitBit);
    float c = 1.0f - b;
    lebMatrix3x3 splitMatrix = {
        {c   , b   , 0.0f},
        {0.5f, 0.0f, 0.5f},
        {0.0f,    c,    b}
    };
    lebMatrix3x3 tmp;

    memcpy(tmp, splittingMatrix, sizeof(tmp));
    leb__Matrix3x3Product(splitMatrix, tmp, splittingMatrix);
}